

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void __thiscall ImGuiStorage::SetInt(ImGuiStorage *this,ImGuiID key,int val)

{
  ImGuiStoragePair *it;
  ImGuiStoragePair local_28;
  
  it = LowerBound(&this->Data,key);
  if ((it == (this->Data).Data + (this->Data).Size) || (it->key != key)) {
    local_28.key = key;
    local_28.field_1.val_i = val;
    ImVector<ImGuiStorage::ImGuiStoragePair>::insert(&this->Data,it,&local_28);
  }
  else {
    (it->field_1).val_i = val;
  }
  return;
}

Assistant:

void ImGuiStorage::SetInt(ImGuiID key, int val)
{
    ImGuiStoragePair* it = LowerBound(Data, key);
    if (it == Data.end() || it->key != key)
    {
        Data.insert(it, ImGuiStoragePair(key, val));
        return;
    }
    it->val_i = val;
}